

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

void __thiscall
boost::ext::di::v1_2_0::core::
pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>>
::
pool<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>>>
          (pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>>
           *this,type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>
                 *param_1,
          pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>_>
          *p)

{
  dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>
  local_38;
  pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>_>
  *local_20;
  pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>_>
  *p_local;
  type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>
  *param_1_local;
  pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>_>
  *this_local;
  
  local_20 = p;
  p_local = (pool<boost::ext::di::v1_2_0::aux::type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>_>
             *)param_1;
  param_1_local =
       (type_list<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,_ILogger,_ConsoleLogger,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>,_boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>_>
        *)this;
  dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>
  ::dependency(&local_38,
               &p->
                super_dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>
              );
  pool<boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::deduce,ILogger,ConsoleLogger,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>,boost::ext::di::v1_2_0::core::dependency<boost::ext::di::v1_2_0::scopes::instance,Engine,std::shared_ptr<Engine>,boost::ext::di::v1_2_0::no_name,void,boost::ext::di::v1_2_0::core::none>>
            (this,&local_38);
  dependency<boost::ext::di::v1_2_0::scopes::instance,_Engine,_std::shared_ptr<Engine>,_boost::ext::di::v1_2_0::no_name,_void,_boost::ext::di::v1_2_0::core::none>
  ::~dependency(&local_38);
  return;
}

Assistant:

pool(const aux::type_list<Ts...>&, TPool p) noexcept : pool(static_cast<Ts&&>(p)...) {
    (void)p;
  }